

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 propagateFloatx80NaNOneArg(floatx80 a,float_status *status)

{
  unkuint10 Var1;
  int iVar2;
  undefined8 extraout_RDX;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 fVar3;
  floatx80 fVar4;
  float_status *status_local;
  floatx80 a_local;
  
  a_local.low._0_2_ = a.high;
  Var1 = a._0_10_;
  a_00._10_6_ = 0;
  a_00.low = (long)Var1;
  a_00.high = (short)(Var1 >> 0x40);
  iVar2 = floatx80_is_signaling_nan_m68k(a_00,status);
  fVar3._8_8_ = extraout_RDX;
  fVar3.low = a.low;
  if (iVar2 != 0) {
    float_raise_m68k('\x01',status);
    a_01._10_6_ = 0;
    a_01.low = (long)Var1;
    a_01.high = (short)(Var1 >> 0x40);
    fVar3 = floatx80_silence_nan_m68k(a_01,status);
    a_local.low._0_2_ = fVar3.high;
  }
  if (status->default_nan_mode != '\0') {
    fVar3 = floatx80_default_nan_m68k(status);
    a_local.low._0_2_ = fVar3.high;
  }
  a_local._8_8_ = fVar3.low;
  fVar4._10_6_ = fVar3._10_6_;
  fVar4.high = (uint16_t)a_local.low;
  fVar4.low = a_local._8_8_;
  return fVar4;
}

Assistant:

static floatx80 propagateFloatx80NaNOneArg(floatx80 a, float_status *status)
{
    if (floatx80_is_signaling_nan(a, status)) {
        float_raise(float_flag_invalid, status);
        a = floatx80_silence_nan(a, status);
    }

    if (status->default_nan_mode) {
        return floatx80_default_nan(status);
    }

    return a;
}